

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O1

int __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
::DeleteElement(RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
                *this,RTPIPv6Destination *elem)

{
  in_port_t iVar1;
  undefined8 uVar2;
  HashElement *pHVar3;
  RTPMemoryManager *pRVar4;
  int iVar5;
  HashElement *pHVar6;
  bool bVar7;
  HashElement *pHVar8;
  undefined1 auVar9 [16];
  
  uVar2 = *(undefined8 *)((long)&(elem->rtpaddr).sin6_addr.__in6_u + 8);
  pHVar8 = this->table
           [((uint)(byte)((ulong)uVar2 >> 0x38) | (uint)((ulong)uVar2 >> 0x18) & 0xff0000 |
             (uint)((ulong)uVar2 >> 8) & 0xff000000 | (uint)((ulong)uVar2 >> 0x28) & 0xff00) %
            0x207d];
  this->curhashelem = pHVar8;
  iVar1 = (elem->rtpaddr).sin6_port;
  bVar7 = false;
  do {
    pHVar6 = pHVar8;
    if (pHVar6 == (HashElement *)0x0) {
      iVar5 = -5;
      goto LAB_001272df;
    }
    if (((pHVar6->element).rtpaddr.sin6_port == iVar1) &&
       (auVar9[0] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0] ==
                     (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[0]),
       auVar9[1] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[1] ==
                    (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[1]),
       auVar9[2] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[2] ==
                    (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[2]),
       auVar9[3] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[3] ==
                    (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[3]),
       auVar9[4] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[4] ==
                    (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[4]),
       auVar9[5] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[5] ==
                    (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[5]),
       auVar9[6] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[6] ==
                    (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[6]),
       auVar9[7] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[7] ==
                    (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[7]),
       auVar9[8] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[8] ==
                    (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[8]),
       auVar9[9] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[9] ==
                    (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[9]),
       auVar9[10] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[10] ==
                     (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[10]),
       auVar9[0xb] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xb] ==
                      (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[0xb]),
       auVar9[0xc] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xc] ==
                      (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[0xc]),
       auVar9[0xd] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xd] ==
                      (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[0xd]),
       auVar9[0xe] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xe] ==
                      (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[0xe]),
       auVar9[0xf] = -((pHVar6->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xf] ==
                      (elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8[0xf]),
       (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
       == 0xffff)) {
      bVar7 = true;
      pHVar8 = pHVar6;
    }
    else {
      pHVar8 = pHVar6->hashnext;
      this->curhashelem = pHVar8;
    }
  } while (!bVar7);
  iVar5 = 0;
LAB_001272df:
  if (pHVar6 == (HashElement *)0x0) {
    return iVar5;
  }
  pHVar8 = this->curhashelem;
  if (pHVar8 == (HashElement *)0x0) {
    return -7;
  }
  pHVar6 = pHVar8->hashprev;
  pHVar3 = pHVar8->hashnext;
  if (pHVar6 == (HashElement *)0x0) {
    this->table[pHVar8->hashindex] = pHVar3;
    if (pHVar3 == (HashElement *)0x0) goto LAB_00127329;
    pHVar6 = (HashElement *)0x0;
  }
  else {
    pHVar6->hashnext = pHVar3;
    if (pHVar3 == (HashElement *)0x0) goto LAB_00127329;
  }
  pHVar3->hashprev = pHVar6;
LAB_00127329:
  pHVar8 = this->curhashelem;
  pHVar6 = pHVar8->listprev;
  pHVar3 = pHVar8->listnext;
  if (pHVar6 == (HashElement *)0x0) {
    this->firsthashelem = pHVar3;
    if (pHVar3 == (HashElement *)0x0) {
      this->lasthashelem = (HashElement *)0x0;
    }
    else {
      pHVar3->listprev = (HashElement *)0x0;
    }
  }
  else {
    pHVar6->listnext = pHVar3;
    if (pHVar3 == (HashElement *)0x0) {
      this->lasthashelem = pHVar6;
    }
    else {
      pHVar3->listprev = pHVar6;
    }
  }
  pRVar4 = (this->super_RTPMemoryObject).mgr;
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    if (pHVar8 != (HashElement *)0x0) {
      operator_delete(pHVar8,0x60);
    }
  }
  else {
    (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pHVar8);
  }
  this->curhashelem = pHVar3;
  return 0;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::DeleteElement(const Element &elem)
{
	int status;

	status = GotoElement(elem);
	if (status < 0)
		return status;
	return DeleteCurrentElement();
}